

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_getopt_long.c
# Opt level: O2

int parse_long_options(char **nargv,char *options,option *long_options,int *idx,int short_too,
                      int flags)

{
  char *__s2;
  bool bVar1;
  int iVar2;
  char *__s;
  int iVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  size_t __n;
  int iVar8;
  int *piVar9;
  int local_84;
  char *local_50;
  
  __s = place;
  iVar2 = optind;
  if ((ulong)(uint)dash_prefix < 3) {
    pcVar5 = &DAT_0011159c + *(int *)(&DAT_0011159c + (ulong)(uint)dash_prefix * 4);
  }
  else {
    pcVar5 = "";
  }
  optind = optind + 1;
  local_50 = strchr(place,0x3d);
  if (local_50 == (char *)0x0) {
    __n = strlen(__s);
    local_50 = (char *)0x0;
  }
  else {
    __n = (long)local_50 - (long)__s;
    local_50 = local_50 + 1;
  }
  local_84 = -1;
  iVar8 = 0;
  bVar1 = false;
  for (piVar9 = &long_options->val; __s2 = ((option *)(piVar9 + -6))->name, __s2 != (char *)0x0;
      piVar9 = piVar9 + 8) {
    iVar3 = strncmp(__s,__s2,__n);
    iVar4 = local_84;
    if (iVar3 == 0) {
      sVar6 = strlen(__s2);
      if (sVar6 == __n) goto LAB_0010a850;
      if (((__n != 1 || short_too == 0) && (iVar4 = iVar8, local_84 != -1)) &&
         (((flags & 4U) != 0 ||
          (((lVar7 = (long)local_84, piVar9[-4] != long_options[lVar7].has_arg ||
            (*(int **)(piVar9 + -2) != long_options[lVar7].flag)) ||
           (iVar4 = local_84, *piVar9 != long_options[lVar7].val)))))) {
        bVar1 = true;
        iVar4 = local_84;
      }
    }
    local_84 = iVar4;
    iVar8 = iVar8 + 1;
  }
  if (bVar1) {
    if ((opterr != 0) && (*options != ':')) {
      warnx("option `%s%.*s\' is ambiguous",pcVar5,__n & 0xffffffff,__s);
    }
  }
  else {
    iVar8 = local_84;
    if (local_84 != -1) {
LAB_0010a850:
      iVar4 = long_options[iVar8].has_arg;
      if (local_50 == (char *)0x0 || iVar4 != 0) {
        if (iVar4 - 1U < 2) {
          if (local_50 == (char *)0x0) {
            if (iVar4 == 1) {
              optind = iVar2 + 2;
              optarg = nargv[(long)iVar2 + 1];
              iVar4 = long_options[iVar8].has_arg;
            }
            else {
              iVar4 = 2;
            }
          }
          else {
            optarg = local_50;
          }
        }
        if ((iVar4 == 1) && (optarg == (char *)0x0)) {
          if ((opterr != 0) && (*options != ':')) {
            warnx("option `%s%s\' requires an argument",pcVar5,__s);
          }
          optopt = 0;
          if (long_options[iVar8].flag == (int *)0x0) {
            optopt = long_options[iVar8].val;
          }
          optind = optind + -1;
          return (uint)(*options != ':') * 5 + 0x3a;
        }
        if (idx != (int *)0x0) {
          *idx = iVar8;
        }
        if (long_options[iVar8].flag != (int *)0x0) {
          *long_options[iVar8].flag = long_options[iVar8].val;
          return 0;
        }
        return long_options[iVar8].val;
      }
      if ((opterr != 0) && (*options != ':')) {
        warnx("option `%s%.*s\' doesn\'t allow an argument",pcVar5,__n & 0xffffffff,__s);
      }
      if (long_options[iVar8].flag != (int *)0x0) {
        optopt = 0;
        return 0x3f;
      }
      optopt = long_options[iVar8].val;
      return 0x3f;
    }
    if (short_too != 0) {
      optind = iVar2;
      return -1;
    }
    if ((opterr != 0) && (*options != ':')) {
      warnx("unrecognized option `%s%s\'",pcVar5,__s);
    }
  }
  optopt = 0;
  return 0x3f;
}

Assistant:

static int
parse_long_options(char * const *nargv, const char *options,
	const struct option *long_options, int *idx, int short_too, int flags)
{
	char *current_argv, *has_equal;
#ifdef GNU_COMPATIBLE
	char *current_dash;
#endif
	size_t current_argv_len;
	int i, match, exact_match, second_partial_match;

	current_argv = place;
#ifdef GNU_COMPATIBLE
	switch (dash_prefix) {
		case D_PREFIX:
			current_dash = "-";
			break;
		case DD_PREFIX:
			current_dash = "--";
			break;
		case W_PREFIX:
			current_dash = "-W ";
			break;
		default:
			current_dash = "";
			break;
	}
#endif
	match = -1;
	exact_match = 0;
	second_partial_match = 0;

	optind++;

	if ((has_equal = strchr(current_argv, '=')) != NULL) {
		/* argument found (--option=arg) */
		current_argv_len = (size_t)(has_equal - current_argv);
		has_equal++;
	} else
		current_argv_len = strlen(current_argv);

	for (i = 0; long_options[i].name; i++) {
		/* find matching long option */
		if (strncmp(current_argv, long_options[i].name,
		    current_argv_len))
			continue;

		if (strlen(long_options[i].name) == current_argv_len) {
			/* exact match */
			match = i;
			exact_match = 1;
			break;
		}
		/*
		 * If this is a known short option, don't allow
		 * a partial match of a single character.
		 */
		if (short_too && current_argv_len == 1)
			continue;

		if (match == -1)	/* first partial match */
			match = i;
		else if ((flags & FLAG_LONGONLY) ||
			 long_options[i].has_arg !=
			     long_options[match].has_arg ||
			 long_options[i].flag != long_options[match].flag ||
			 long_options[i].val != long_options[match].val)
			second_partial_match = 1;
	}
	if (!exact_match && second_partial_match) {
		/* ambiguous abbreviation */
		if (PRINT_ERROR)
			warnx(ambig,
#ifdef GNU_COMPATIBLE
			     current_dash,
#endif
			     (int)current_argv_len,
			     current_argv);
		optopt = 0;
		return (BADCH);
	}
	if (match != -1) {		/* option found */
		if (long_options[match].has_arg == no_argument
		    && has_equal) {
			if (PRINT_ERROR)
				warnx(noarg,
#ifdef GNU_COMPATIBLE
				     current_dash,
#endif
				     (int)current_argv_len,
				     current_argv);
			/*
			 * XXX: GNU sets optopt to val regardless of flag
			 */
			if (long_options[match].flag == NULL)
				optopt = long_options[match].val;
			else
				optopt = 0;
#ifdef GNU_COMPATIBLE
			return (BADCH);
#else
			return (BADARG);
#endif
		}
		if (long_options[match].has_arg == required_argument ||
		    long_options[match].has_arg == optional_argument) {
			if (has_equal)
				optarg = has_equal;
			else if (long_options[match].has_arg ==
			    required_argument) {
				/*
				 * optional argument doesn't use next nargv
				 */
				optarg = nargv[optind++];
			}
		}
		if ((long_options[match].has_arg == required_argument)
		    && (optarg == NULL)) {
			/*
			 * Missing argument; leading ':' indicates no error
			 * should be generated.
			 */
			if (PRINT_ERROR)
				warnx(recargstring,
#ifdef GNU_COMPATIBLE
				    current_dash,
#endif
				    current_argv);
			/*
			 * XXX: GNU sets optopt to val regardless of flag
			 */
			if (long_options[match].flag == NULL)
				optopt = long_options[match].val;
			else
				optopt = 0;
			--optind;
			return (BADARG);
		}
	} else {			/* unknown option */
		if (short_too) {
			--optind;
			return (-1);
		}
		if (PRINT_ERROR)
			warnx(illoptstring,
#ifdef GNU_COMPATIBLE
			      current_dash,
#endif
			      current_argv);
		optopt = 0;
		return (BADCH);
	}
	if (idx)
		*idx = match;
	if (long_options[match].flag) {
		*long_options[match].flag = long_options[match].val;
		return (0);
	} else
		return (long_options[match].val);
}